

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_slots.cpp
# Opt level: O3

Am_Slot_Key Am_From_Slot_Name(char *string)

{
  Am_Symbol_Table *pAVar1;
  int iVar2;
  const_iterator cVar3;
  _Base_ptr *pp_Var4;
  char *local_20;
  
  if (Am_Slot_Name_Key_Table == (Am_Symbol_Table *)0x0) {
    Am_Slot_Name_Key_Table = Am_Symbol_Table::Create(500);
  }
  pAVar1 = Am_Slot_Name_Key_Table;
  local_20 = string;
  cVar3 = std::
          _Rb_tree<const_char_*,_std::pair<const_char_*const,_int>,_std::_Select1st<std::pair<const_char_*const,_int>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
          ::find((_Rb_tree<const_char_*,_std::pair<const_char_*const,_int>,_std::_Select1st<std::pair<const_char_*const,_int>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                  *)Am_Slot_Name_Key_Table,&local_20);
  pp_Var4 = (_Base_ptr *)&(pAVar1->Am_Map_CStr2Int).mDefaultReturn;
  if ((_Rb_tree_header *)cVar3._M_node !=
      &(pAVar1->Am_Map_CStr2Int).mMap._M_t._M_impl.super__Rb_tree_header) {
    pp_Var4 = &cVar3._M_node[1]._M_parent;
  }
  iVar2 = 0;
  if (*(int *)pp_Var4 != -1) {
    iVar2 = *(int *)pp_Var4;
  }
  return (Am_Slot_Key)iVar2;
}

Assistant:

Am_Slot_Key
Am_From_Slot_Name(const char *string)
{
  verify_slot_name_key_table();
  int prev_key = Am_Slot_Name_Key_Table->Get_Value(string);
  if (prev_key == -1)
    return 0;
  else
    return (Am_Slot_Key)prev_key;
}